

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

bool __thiscall QMdiSubWindow::event(QMdiSubWindow *this,QEvent *event)

{
  QIcon *this_00;
  ushort uVar1;
  uint uVar2;
  QFlagsStorageHelper<QStyle::StateFlag,_4> QVar3;
  int iVar4;
  int iVar5;
  QMdiSubWindowPrivate *this_01;
  Data *pDVar6;
  QWidgetData *pQVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  int ah;
  QSize QVar13;
  QWidget *pQVar14;
  QStyle *pQVar15;
  QWidget *pQVar16;
  ulong uVar17;
  QObject *pQVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QLatin1StringView s;
  undefined1 local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 - 0x71 < 3) {
    QWidget::update(&this->super_QWidget);
    goto LAB_0041b45f;
  }
  this_01 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (uVar1 == 0x15) {
    bVar12 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
    QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_01);
    this_01->currentOperation = None;
    this_01->hoveredSubControl = SC_None;
    this_01->activeSubControl = SC_None;
    if (this_01->isInRubberBandMode == true) {
      QMdiSubWindowPrivate::leaveRubberBandMode(this_01);
    }
    this_01->isShadeMode = false;
    this_01->isMaximizeMode = false;
    this_01->isWidgetHiddenByUs = false;
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) == 0) {
      pQVar15 = QWidget::style(&this->super_QWidget);
      bVar11 = isMacStyle(pQVar15);
      if ((((bVar11) && (pDVar6 = (this_01->sizeGrip).wp.d, pDVar6 != (Data *)0x0)) &&
          (*(int *)(pDVar6 + 4) != 0)) &&
         (pQVar18 = (this_01->sizeGrip).wp.value, pQVar18 != (QObject *)0x0)) {
        (**(code **)(*(long *)pQVar18 + 0x20))();
      }
      setOption(this,RubberBandResize,false);
      setOption(this,RubberBandMove,false);
    }
    else {
      (**(code **)(*(long *)&this_01->super_QWidgetPrivate + 0x28))(this_01);
    }
    QWidget::setContentsMargins(&this->super_QWidget,0,0,0,0);
    QMdiSubWindowPrivate::updateGeometryConstraints(this_01);
    QMdiSubWindowPrivate::updateCursor(this_01);
    QMdiSubWindowPrivate::updateMask(this_01);
    QMdiSubWindowPrivate::updateDirtyRegions(this_01);
    QMdiSubWindowPrivate::updateActions(this_01);
    if (!bVar12) {
      bVar12 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
      if (bVar12) {
        QWidget::setAttribute(&this->super_QWidget,WA_Resized,false);
      }
    }
    goto LAB_0041b45f;
  }
  if (uVar1 == 0x18) {
    if (this_01->ignoreNextActivationEvent == true) {
LAB_0041b0d7:
      this_01->ignoreNextActivationEvent = false;
      goto LAB_0041b45f;
    }
    this_01->isExplicitlyDeactivated = false;
    bVar12 = true;
  }
  else {
    if (uVar1 != 0x19) {
      if (uVar1 == 0x21) {
        if (this_01->ignoreWindowTitleChange == false) {
          QMdiSubWindowPrivate::updateWindowTitle(this_01,false);
        }
      }
      else {
        if (uVar1 == 0x22) {
          QWidget::windowIcon((QWidget *)local_a8);
          this_00 = &this_01->menuIcon;
          QIcon::operator=(this_00,(QIcon *)local_a8);
          QIcon::~QIcon((QIcon *)local_a8);
          cVar10 = QIcon::isNull();
          if (cVar10 != '\0') {
            pQVar15 = QWidget::style(&this->super_QWidget);
            (**(code **)(*(long *)pQVar15 + 0x100))((QIcon *)local_a8,pQVar15,0,0,this);
            QIcon::operator=(this_00,(QIcon *)local_a8);
            QIcon::~QIcon((QIcon *)local_a8);
          }
          bVar12 = QPointer::operator_cast_to_bool((QPointer *)&this_01->controlContainer);
          if (bVar12) {
            QMdi::ControlContainer::updateWindowIcon
                      ((ControlContainer *)(this_01->controlContainer).wp.value,this_00);
          }
          pQVar14 = maximizedSystemMenuIconWidget(this);
          if (pQVar14 == (QWidget *)0x0) {
            pQVar7 = (this->super_QWidget).data;
            iVar4 = (pQVar7->crect).x2.m_i;
            iVar5 = (pQVar7->crect).x1.m_i;
            ah = QMdiSubWindowPrivate::titleBarHeight(this_01);
            QWidget::update(&this->super_QWidget,0,0,(iVar4 - iVar5) + 1,ah);
          }
          goto LAB_0041b45f;
        }
        if (uVar1 == 0x27) {
          QMdiSubWindowPrivate::desktopPalette((QMdiSubWindowPrivate *)local_a8);
          QVar3.super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorage<QStyle::StateFlag>)(this_01->titleBarPalette).currentGroup;
          (this_01->titleBarPalette).currentGroup = local_a8._8_4_;
          QVar13 = (QSize)(this_01->titleBarPalette).d;
          (this_01->titleBarPalette).d = (QPalettePrivate *)local_a8._0_8_;
          local_a8._0_8_ = QVar13;
          local_a8._8_4_ = QVar3.super_QFlagsStorage<QStyle::StateFlag>.i;
          QPalette::~QPalette((QPalette *)local_a8);
          goto LAB_0041b45f;
        }
        if (uVar1 == 0x4c) {
          QMdiSubWindowPrivate::updateGeometryConstraints(this_01);
          goto LAB_0041b45f;
        }
        if (uVar1 == 0x5a) {
          QMdiSubWindowPrivate::updateDirtyRegions(this_01);
          goto LAB_0041b45f;
        }
        if (uVar1 == 0x61) {
          QFont::operator=(&this_01->font,&((this->super_QWidget).data)->fnt);
          goto LAB_0041b45f;
        }
        if (uVar1 == 0x83) goto LAB_0041b370;
        if (uVar1 != 0x66) {
          if (uVar1 == 0x6e) {
            QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_01);
            showToolTip((QHelpEvent *)event,&this->super_QWidget,(QStyleOptionComplex *)local_a8,
                        CC_TitleBar,this_01->hoveredSubControl);
            QStyleOptionTitleBar::~QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
          }
          else if (uVar1 == 100) {
            bVar12 = this_01->isShadeMode;
            bVar8 = QWidget::isMinimized(&this->super_QWidget);
            bVar9 = QWidget::isMaximized(&this->super_QWidget);
            bVar11 = this_01->activationEnabled;
            this_01->activationEnabled = false;
            QWidget::ensurePolished(&this->super_QWidget);
            QWidget::setContentsMargins(&this->super_QWidget,0,0,0,0);
            if (((bVar8 || bVar9) | bVar12) == 1) {
              QWidget::showNormal(&this->super_QWidget);
            }
            QMdiSubWindowPrivate::updateGeometryConstraints(this_01);
            QVar13 = QWidget::size(&this->super_QWidget);
            uVar17 = (ulong)QVar13 >> 0x20;
            uVar2 = (this_01->internalMinimumSize).wd.m_i;
            uVar19 = (ulong)uVar2;
            if ((int)uVar2 <= QVar13.wd.m_i.m_i) {
              uVar19 = (ulong)QVar13 & 0xffffffff;
            }
            uVar2 = (this_01->internalMinimumSize).ht.m_i;
            if (QVar13.ht.m_i.m_i < (int)uVar2) {
              uVar17 = (ulong)uVar2;
            }
            local_a8._0_8_ = uVar19 | uVar17 << 0x20;
            QWidget::resize(&this->super_QWidget,(QSize *)local_a8);
            QMdiSubWindowPrivate::updateMask(this_01);
            QMdiSubWindowPrivate::updateDirtyRegions(this_01);
            if (bVar12 == false) {
              if (bVar8) {
                QWidget::showMinimized(&this->super_QWidget);
              }
              else if (bVar9) {
                QWidget::showMaximized(&this->super_QWidget);
              }
            }
            else {
              showShaded(this);
            }
            this_01->activationEnabled = bVar11;
          }
          goto LAB_0041b45f;
        }
        QWidget::windowTitle((QString *)local_a8,&this->super_QWidget);
        s.m_data = "[*]";
        s.m_size = 3;
        bVar12 = QString::contains((QString *)local_a8,s,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
        if (!bVar12) goto LAB_0041b45f;
        pQVar14 = maximizedButtonsWidget(this);
        if (pQVar14 != (QWidget *)0x0) {
          pDVar6 = (this_01->controlContainer).wp.d;
          if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
            pQVar18 = (QObject *)0x0;
          }
          else {
            pQVar18 = (this_01->controlContainer).wp.value;
          }
          if (((*(long *)(pQVar18 + 0x30) != 0) && (*(int *)(*(long *)(pQVar18 + 0x30) + 4) != 0))
             && (*(long *)(pQVar18 + 0x38) != 0)) {
            pQVar14 = QMenuBar::cornerWidget
                                (*(QMenuBar **)((this_01->controlContainer).wp.value + 0x38),
                                 TopRightCorner);
            pQVar16 = maximizedButtonsWidget(this);
            if (pQVar14 == pQVar16) {
              pQVar14 = QWidget::window(&this->super_QWidget);
              bVar12 = QWidget::isWindowModified(&this->super_QWidget);
              QWidget::setWindowModified(pQVar14,bVar12);
            }
          }
        }
      }
      QMdiSubWindowPrivate::updateInternalWindowTitle(this_01);
      goto LAB_0041b45f;
    }
    if (this_01->ignoreNextActivationEvent == true) goto LAB_0041b0d7;
    this_01->isExplicitlyDeactivated = true;
LAB_0041b370:
    bVar12 = false;
  }
  QMdiSubWindowPrivate::setActive(this_01,bVar12,true);
LAB_0041b45f:
  bVar12 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool QMdiSubWindow::event(QEvent *event)
{
    Q_D(QMdiSubWindow);
    switch (event->type()) {
    case QEvent::StyleChange: {
        bool wasShaded = isShaded();
        bool wasMinimized = isMinimized();
        bool wasMaximized = isMaximized();
        // Don't emit subWindowActivated, the app doesn't have to know about our hacks
        const QScopedValueRollback<bool> activationEnabledSaver(d->activationEnabled);
        d->activationEnabled = false;

        ensurePolished();
        setContentsMargins(0, 0, 0, 0);
        if (wasMinimized || wasMaximized || wasShaded)
            showNormal();
        d->updateGeometryConstraints();
        resize(d->internalMinimumSize.expandedTo(size()));
        d->updateMask();
        d->updateDirtyRegions();
        if (wasShaded)
            showShaded();
        else if (wasMinimized)
            showMinimized();
        else if (wasMaximized)
            showMaximized();
        break;
    }
    case QEvent::ParentAboutToChange:
        d->setActive(false);
        break;
    case QEvent::ParentChange: {
        bool wasResized = testAttribute(Qt::WA_Resized);
#if QT_CONFIG(menubar)
        d->removeButtonsFromMenuBar();
#endif
        d->currentOperation = QMdiSubWindowPrivate::None;
        d->activeSubControl = QStyle::SC_None;
        d->hoveredSubControl = QStyle::SC_None;
#if QT_CONFIG(rubberband)
        if (d->isInRubberBandMode)
            d->leaveRubberBandMode();
#endif
        d->isShadeMode = false;
        d->isMaximizeMode = false;
        d->isWidgetHiddenByUs = false;
        if (!parent()) {
#if QT_CONFIG(sizegrip)
            if (isMacStyle(style()))
                delete d->sizeGrip;
#endif
            setOption(RubberBandResize, false);
            setOption(RubberBandMove, false);
        } else {
            d->setWindowFlags(windowFlags());
        }
        setContentsMargins(0, 0, 0, 0);
        d->updateGeometryConstraints();
        d->updateCursor();
        d->updateMask();
        d->updateDirtyRegions();
        d->updateActions();
        if (!wasResized && testAttribute(Qt::WA_Resized))
            setAttribute(Qt::WA_Resized, false);
        break;
    }
    case QEvent::WindowActivate:
        if (d->ignoreNextActivationEvent) {
            d->ignoreNextActivationEvent = false;
            break;
        }
        d->isExplicitlyDeactivated = false;
        d->setActive(true);
        break;
    case QEvent::WindowDeactivate:
        if (d->ignoreNextActivationEvent) {
            d->ignoreNextActivationEvent = false;
            break;
        }
        d->isExplicitlyDeactivated = true;
        d->setActive(false);
        break;
    case QEvent::WindowTitleChange:
        if (!d->ignoreWindowTitleChange)
            d->updateWindowTitle(false);
        d->updateInternalWindowTitle();
        break;
    case QEvent::ModifiedChange:
        if (!windowTitle().contains("[*]"_L1))
            break;
#if QT_CONFIG(menubar)
        if (maximizedButtonsWidget() && d->controlContainer->menuBar() && d->controlContainer->menuBar()
                ->cornerWidget(Qt::TopRightCorner) == maximizedButtonsWidget()) {
            window()->setWindowModified(isWindowModified());
        }
#endif // QT_CONFIG(menubar)
        d->updateInternalWindowTitle();
        break;
    case QEvent::LayoutDirectionChange:
        d->updateDirtyRegions();
        break;
    case QEvent::LayoutRequest:
        d->updateGeometryConstraints();
        break;
    case QEvent::WindowIconChange:
        d->menuIcon = windowIcon();
        if (d->menuIcon.isNull())
            d->menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, this);
        if (d->controlContainer)
            d->controlContainer->updateWindowIcon(d->menuIcon);
        if (!maximizedSystemMenuIconWidget())
            update(0, 0, width(), d->titleBarHeight());
        break;
    case QEvent::PaletteChange:
        d->titleBarPalette = d->desktopPalette();
        break;
    case QEvent::FontChange:
        d->font = font();
        break;
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        showToolTip(static_cast<QHelpEvent *>(event), this, d->titleBarOptions(),
                    QStyle::CC_TitleBar, d->hoveredSubControl);
        break;
#endif
#ifndef QT_NO_ACTION
    case QEvent::ActionAdded:
    case QEvent::ActionChanged:
    case QEvent::ActionRemoved:
        update();
        break;
#endif
    default:
        break;
    }
    return QWidget::event(event);
}